

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
     format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v10::appender,_char> *ctx)

{
  undefined8 this;
  char *it;
  iterator it_00;
  undefined1 local_60 [8];
  formatter<fmt::v10::detail::styled_arg<char[7]>,_char,_void> f;
  basic_format_context<fmt::v10::appender,_char> *ctx_local;
  parse_context_type *parse_ctx_local;
  void *arg_local;
  
  f.super_formatter<char[7],_char,_void>.
  super_formatter<fmt::v10::basic_string_view<char>,_char,_void>.specs_.precision_ref.val.name.size_
       = (size_t)ctx;
  memset(local_60,0,0x40);
  formatter<fmt::v10::detail::styled_arg<char[7]>,_char,_void>::formatter
            ((formatter<fmt::v10::detail::styled_arg<char[7]>,_char,_void> *)local_60);
  it = formatter<fmt::v10::basic_string_view<char>,char,void>::
       parse<fmt::v10::basic_format_parse_context<char>>
                 ((formatter<fmt::v10::basic_string_view<char>,char,void> *)local_60,parse_ctx);
  basic_format_parse_context<char>::advance_to(parse_ctx,it);
  this = f.super_formatter<char[7],_char,_void>.
         super_formatter<fmt::v10::basic_string_view<char>,_char,_void>.specs_.precision_ref.val.
         name.size_;
  it_00 = formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>::
          format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                    ((formatter<fmt::v10::detail::styled_arg<char[7]>,char,void> *)local_60,
                     (styled_arg<char[7]> *)arg,
                     (basic_format_context<fmt::v10::appender,_char> *)
                     f.super_formatter<char[7],_char,_void>.
                     super_formatter<fmt::v10::basic_string_view<char>,_char,_void>.specs_.
                     precision_ref.val.name.size_);
  basic_format_context<fmt::v10::appender,_char>::advance_to
            ((basic_format_context<fmt::v10::appender,_char> *)this,it_00);
  return;
}

Assistant:

static void format_custom_arg(void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_const_formatter<T, Context>(), const T, T>;
    ctx.advance_to(f.format(*static_cast<qualified_type*>(arg), ctx));
  }